

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

opj_pi_iterator_t *
pi_initialise_encode(opj_image_t *image,opj_cp_t *cp,int tileno,J2K_T2_MODE t2_mode)

{
  opj_pi_comp_t *poVar1;
  int *piVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  undefined4 uVar5;
  opj_tcp_t *poVar6;
  opj_tccp_t *poVar7;
  opj_image_comp_t *poVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  opj_pi_iterator_t *pi;
  opj_pi_comp_t *poVar14;
  opj_pi_resolution_t *poVar15;
  short *psVar16;
  byte bVar17;
  byte bVar18;
  long lVar19;
  int iVar20;
  OPJ_UINT32 OVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  OPJ_UINT32 OVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  uint uVar36;
  OPJ_UINT32 local_b8;
  int local_b4;
  long local_60;
  
  poVar6 = cp->tcps;
  pi = (opj_pi_iterator_t *)calloc((long)poVar6[tileno].numpocs + 1,0xf8);
  if (pi == (opj_pi_iterator_t *)0x0) {
LAB_001fafce:
    pi = (opj_pi_iterator_t *)0x0;
  }
  else {
    pi->tp_on = cp->tp_on;
    if (-1 < poVar6[tileno].numpocs) {
      local_b8 = 0;
      local_b4 = 0;
      lVar34 = 0;
      do {
        iVar11 = tileno / cp->tw;
        iVar20 = tileno % cp->tw;
        iVar13 = cp->tx0;
        iVar12 = cp->tdx;
        OVar27 = iVar12 * iVar20 + iVar13;
        if ((int)OVar27 <= (int)image->x0) {
          OVar27 = image->x0;
        }
        pi[lVar34].tx0 = OVar27;
        iVar30 = cp->ty0;
        iVar25 = cp->tdy;
        OVar27 = iVar25 * iVar11 + iVar30;
        if ((int)OVar27 <= (int)image->y0) {
          OVar27 = image->y0;
        }
        pi[lVar34].ty0 = OVar27;
        OVar27 = (iVar20 + 1) * iVar12 + iVar13;
        if ((int)image->x1 <= (int)OVar27) {
          OVar27 = image->x1;
        }
        pi[lVar34].tx1 = OVar27;
        OVar27 = (iVar11 + 1) * iVar25 + iVar30;
        if ((int)image->y1 <= (int)OVar27) {
          OVar27 = image->y1;
        }
        pi[lVar34].ty1 = OVar27;
        uVar3 = image->numcomps;
        pi[lVar34].numcomps = uVar3;
        poVar14 = (opj_pi_comp_t *)calloc((ulong)uVar3,0x18);
        pi[lVar34].comps = poVar14;
        if (poVar14 == (opj_pi_comp_t *)0x0) {
LAB_001fafbf:
          pi_destroy(pi,cp,tileno);
          goto LAB_001fafce;
        }
        if (0 < pi[lVar34].numcomps) {
          local_60 = 0x3b0;
          lVar19 = 0;
          do {
            poVar14 = pi[lVar34].comps;
            poVar7 = poVar6[tileno].tccps;
            poVar8 = image->comps;
            OVar27 = poVar8[lVar19].dx;
            poVar14[lVar19].dx = OVar27;
            OVar4 = poVar8[lVar19].dy;
            poVar14[lVar19].dy = OVar4;
            OVar21 = poVar7[lVar19].numresolutions;
            lVar33 = (long)(int)OVar21;
            poVar14[lVar19].numresolutions = OVar21;
            poVar15 = (opj_pi_resolution_t *)malloc(lVar33 << 4);
            poVar14[lVar19].resolutions = poVar15;
            if (poVar15 == (opj_pi_resolution_t *)0x0) {
              pi_destroy(pi,cp,tileno);
            }
            else {
              if ((int)local_b8 < (int)OVar21) {
                local_b8 = OVar21;
              }
              if (0 < (int)OVar21) {
                iVar13 = pi[lVar34].ty1;
                iVar12 = pi[lVar34].tx1;
                iVar11 = pi[lVar34].ty0;
                iVar20 = pi[lVar34].tx0;
                uVar3 = poVar7[lVar19].csty;
                lVar22 = 0;
                do {
                  OVar21 = OVar21 - 1;
                  if ((uVar3 & 1) == 0) {
                    (&poVar15->pdx)[lVar22] = 0xf;
                    iVar30 = 0xf;
                  }
                  else {
                    (&poVar15->pdx)[lVar22] = *(int *)((long)poVar7 + lVar22 + local_60 + -0x84);
                    iVar30 = *(int *)((long)poVar7->stepsizes + lVar22 + local_60 + -0x1c);
                  }
                  bVar17 = (byte)OVar21;
                  iVar25 = 1 << (bVar17 & 0x1f);
                  uVar31 = (int)((OVar27 - 1) + iVar20) / (int)OVar27 + -1 + iVar25 >>
                           (bVar17 & 0x1f);
                  uVar28 = (int)((OVar4 - 1) + iVar11) / (int)OVar4 + -1 + iVar25 >> (bVar17 & 0x1f)
                  ;
                  uVar29 = (int)(iVar12 + (OVar27 - 1)) / (int)OVar27 + -1 + iVar25 >>
                           (bVar17 & 0x1f);
                  uVar26 = iVar25 + (int)(iVar13 + (OVar4 - 1)) / (int)OVar4 + -1 >> (bVar17 & 0x1f)
                  ;
                  (&poVar15->pdy)[lVar22] = iVar30;
                  bVar17 = (byte)(&poVar15->pdx)[lVar22];
                  bVar18 = (byte)iVar30;
                  uVar36 = -1 << (bVar18 & 0x1f);
                  uVar23 = -1 << (bVar17 & 0x1f);
                  iVar30 = (int)((((1 << (bVar17 & 0x1f)) + uVar29) - 1 & uVar23) -
                                (uVar23 & uVar31)) >> (bVar17 & 0x1f);
                  if (uVar31 == uVar29) {
                    iVar30 = 0;
                  }
                  iVar25 = (int)(((uVar26 + (1 << (bVar18 & 0x1f))) - 1 & uVar36) -
                                (uVar36 & uVar28)) >> (bVar18 & 0x1f);
                  (&poVar15->pw)[lVar22] = iVar30;
                  if (uVar28 == uVar26) {
                    iVar25 = 0;
                  }
                  (&poVar15->ph)[lVar22] = iVar25;
                  if (local_b4 < iVar25 * iVar30) {
                    local_b4 = iVar25 * iVar30;
                  }
                  lVar22 = lVar22 + 4;
                } while (lVar33 * 4 != lVar22);
              }
            }
            if (poVar15 == (opj_pi_resolution_t *)0x0) goto LAB_001fafce;
            lVar19 = lVar19 + 1;
            local_60 = local_60 + 0x438;
          } while (lVar19 < pi[lVar34].numcomps);
        }
        pi[lVar34].step_p = 1;
        pi[lVar34].step_c = local_b4;
        OVar27 = image->numcomps;
        iVar12 = OVar27 * local_b4;
        pi[lVar34].step_r = iVar12;
        iVar12 = iVar12 * local_b8;
        pi[lVar34].step_l = iVar12;
        iVar13 = pi->numcomps;
        if (0 < (long)iVar13) {
          poVar14 = pi->comps;
          lVar19 = 0;
          do {
            iVar11 = poVar14[lVar19].numresolutions;
            lVar33 = (long)iVar11;
            if (0 < lVar33) {
              poVar1 = poVar14 + lVar19;
              poVar15 = poVar1->resolutions;
              iVar20 = poVar1->dx;
              iVar30 = poVar1->dy;
              lVar22 = 0;
              do {
                iVar11 = iVar11 + -1;
                iVar24 = iVar20 << ((char)*(undefined4 *)((long)&poVar15->pdx + lVar22) +
                                    (char)iVar11 & 0x1fU);
                iVar35 = iVar30 << ((char)*(undefined4 *)((long)&poVar15->pdy + lVar22) +
                                    (char)iVar11 & 0x1fU);
                iVar25 = pi->dx;
                iVar32 = iVar24;
                if (iVar25 < iVar24) {
                  iVar32 = iVar25;
                }
                if (iVar25 == 0) {
                  iVar32 = iVar24;
                }
                pi[lVar34].dx = iVar32;
                iVar25 = pi->dy;
                iVar32 = iVar35;
                if (iVar25 < iVar35) {
                  iVar32 = iVar25;
                }
                if (iVar25 == 0) {
                  iVar32 = iVar35;
                }
                pi[lVar34].dy = iVar32;
                lVar22 = lVar22 + 0x10;
              } while (lVar33 * 0x10 != lVar22);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != iVar13);
        }
        if (lVar34 == 0) {
          psVar16 = (short *)calloc((long)iVar12 * (long)poVar6[tileno].numlayers,2);
          pi->include = psVar16;
          if (psVar16 == (short *)0x0) goto LAB_001fafbf;
        }
        else {
          pi[lVar34].include = pi[lVar34 + -1].include;
        }
        if ((poVar6[tileno].POC == 0) || ((t2_mode != FINAL_PASS && (cp->cinema == OFF)))) {
          poVar6[tileno].pocs[lVar34].compS = 0;
          poVar6[tileno].pocs[lVar34].compE = OVar27;
          poVar6[tileno].pocs[lVar34].resE = local_b8;
          poVar6[tileno].pocs[lVar34].layS = 0;
          poVar6[tileno].pocs[lVar34].resS = 0;
          poVar6[tileno].pocs[lVar34].layE = poVar6[tileno].numlayers;
          poVar6[tileno].pocs[lVar34].prg = poVar6[tileno].prg;
        }
        else {
          poVar6[tileno].pocs[lVar34].compE = poVar6[tileno].pocs[lVar34].compno1;
          OVar27 = poVar6[tileno].pocs[lVar34].compno0;
          uVar5 = poVar6[tileno].pocs[lVar34].layno1;
          uVar9 = poVar6[tileno].pocs[lVar34].resno1;
          poVar6[tileno].pocs[lVar34].resS = poVar6[tileno].pocs[lVar34].resno0;
          poVar6[tileno].pocs[lVar34].compS = OVar27;
          poVar6[tileno].pocs[lVar34].layE = uVar5;
          poVar6[tileno].pocs[lVar34].resE = uVar9;
          poVar6[tileno].pocs[lVar34].prg = poVar6[tileno].pocs[lVar34].prg1;
          if (lVar34 != 0) {
            iVar13 = poVar6[tileno].pocs[lVar34 + -1].layE;
            if ((int)uVar5 <= iVar13) {
              iVar13 = 0;
            }
            poVar6[tileno].pocs[lVar34].layS = iVar13;
          }
        }
        poVar6[tileno].pocs[lVar34].prcS = 0;
        poVar6[tileno].pocs[lVar34].prcE = local_b4;
        iVar13 = pi[lVar34].ty0;
        iVar12 = pi[lVar34].tx1;
        iVar11 = pi[lVar34].ty1;
        piVar2 = &poVar6[tileno].pocs[lVar34].txS;
        *piVar2 = pi[lVar34].tx0;
        piVar2[1] = iVar12;
        piVar2[2] = iVar13;
        piVar2[3] = iVar11;
        iVar13 = pi[lVar34].dy;
        poVar6[tileno].pocs[lVar34].dx = pi[lVar34].dx;
        poVar6[tileno].pocs[lVar34].dy = iVar13;
        bVar10 = lVar34 < poVar6[tileno].numpocs;
        lVar34 = lVar34 + 1;
      } while (bVar10);
    }
  }
  return pi;
}

Assistant:

opj_pi_iterator_t *pi_initialise_encode(opj_image_t *image, opj_cp_t *cp, int tileno, J2K_T2_MODE t2_mode){ 
	int p, q, pino;
	int compno, resno;
	int maxres = 0;
	int maxprec = 0;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;
	
	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {	return NULL;}
	pi->tp_on = cp->tp_on;

	for(pino = 0;pino < tcp->numpocs+1 ; pino ++){
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;
		
		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi[pino].numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_malloc(comp->numresolutions * sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi[pino].tx0, comp->dx);
			tcy0 = int_ceildiv(pi[pino].ty0, comp->dy);
			tcx1 = int_ceildiv(pi[pino].tx1, comp->dx);
			tcy1 = int_ceildiv(pi[pino].ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);

				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw * res->ph;
				}
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			opj_pi_comp_t *comp = &pi->comps[compno];
			for (resno = 0; resno < comp->numresolutions; resno++) {
				int dx, dy;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				dx = comp->dx * (1 << (res->pdx + comp->numresolutions - 1 - resno));
				dy = comp->dy * (1 << (res->pdy + comp->numresolutions - 1 - resno));
				pi[pino].dx = !pi->dx ? dx : int_min(pi->dx, dx);
				pi[pino].dy = !pi->dy ? dy : int_min(pi->dy, dy);
			}
		}

		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(tcp->numlayers * pi[pino].step_l, sizeof(short int));
			if(!pi[pino].include) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		/* Generation of boundaries for each prog flag*/
			if(tcp->POC && ( cp->cinema || ((!cp->cinema) && (t2_mode == FINAL_PASS)))){
				tcp->pocs[pino].compS= tcp->pocs[pino].compno0;
				tcp->pocs[pino].compE= tcp->pocs[pino].compno1;
				tcp->pocs[pino].resS = tcp->pocs[pino].resno0;
				tcp->pocs[pino].resE = tcp->pocs[pino].resno1;
				tcp->pocs[pino].layE = tcp->pocs[pino].layno1;
				tcp->pocs[pino].prg  = tcp->pocs[pino].prg1;
				if (pino > 0)
					tcp->pocs[pino].layS = (tcp->pocs[pino].layE > tcp->pocs[pino - 1].layE) ? tcp->pocs[pino - 1].layE : 0;
			}else {
				tcp->pocs[pino].compS= 0;
				tcp->pocs[pino].compE= image->numcomps;
				tcp->pocs[pino].resS = 0;
				tcp->pocs[pino].resE = maxres;
				tcp->pocs[pino].layS = 0;
				tcp->pocs[pino].layE = tcp->numlayers;
				tcp->pocs[pino].prg  = tcp->prg;
			}
			tcp->pocs[pino].prcS = 0;
			tcp->pocs[pino].prcE = maxprec;;
			tcp->pocs[pino].txS = pi[pino].tx0;
			tcp->pocs[pino].txE = pi[pino].tx1;
			tcp->pocs[pino].tyS = pi[pino].ty0;
			tcp->pocs[pino].tyE = pi[pino].ty1;
			tcp->pocs[pino].dx = pi[pino].dx;
			tcp->pocs[pino].dy = pi[pino].dy;
		}
			return pi;
	}